

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void flatcc_json_printer_union_vector_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,flatcc_json_printer_union_type_f *ptf,
               flatcc_json_printer_union_f *pf)

{
  int iVar1;
  char *pcVar2;
  flatbuffers_utype_t fVar3;
  void *p_00;
  void *pvVar4;
  undefined1 local_d8 [8];
  flatcc_json_printer_union_descriptor_t ud;
  char type_name [105];
  flatbuffers_uoffset_t count;
  flatbuffers_utype_t type;
  flatbuffers_utype_t *types;
  flatbuffers_uoffset_t *p;
  flatbuffers_uoffset_t *pt;
  flatcc_json_printer_union_type_f *ptf_local;
  size_t len_local;
  char *name_local;
  int id_local;
  flatcc_json_printer_table_descriptor_t *td_local;
  flatcc_json_printer_t *ctx_local;
  
  p_00 = get_field_ptr(td,id + -1);
  pvVar4 = get_field_ptr(td,id);
  ud.member._0_4_ = td->ttl;
  if (len < 0x65) {
    memcpy(&ud.ttl,name,len);
    builtin_strncpy(type_name + len + -8,"_type",5);
    if ((pvVar4 != (void *)0x0) && (p_00 != (void *)0x0)) {
      flatcc_json_printer_utype_enum_vector_field(ctx,td,id + -1,(char *)&ud.ttl,len + 5,ptf);
      iVar1 = td->count;
      td->count = iVar1 + 1;
      if (iVar1 != 0) {
        pcVar2 = ctx->p;
        ctx->p = pcVar2 + 1;
        *pcVar2 = ',';
      }
      pvVar4 = read_uoffset_ptr(pvVar4);
      _count = read_uoffset_ptr(p_00);
      register0x00000000 = __flatbuffers_uoffset_read_from_pe(pvVar4);
      types = (flatbuffers_utype_t *)((long)pvVar4 + 4);
      _count = (void *)((long)_count + 4);
      print_name(ctx,name,len);
      ctx->level = ctx->level + 1;
      pcVar2 = ctx->p;
      ctx->p = pcVar2 + 1;
      *pcVar2 = '[';
      if (register0x00000000 != 0) {
        fVar3 = __flatbuffers_utype_read_from_pe(_count);
        if (fVar3 == '\0') {
          pcVar2 = ctx->p;
          ctx->p = pcVar2 + 1;
          *pcVar2 = 'n';
          pcVar2 = ctx->p;
          ctx->p = pcVar2 + 1;
          *pcVar2 = 'u';
          pcVar2 = ctx->p;
          ctx->p = pcVar2 + 1;
          *pcVar2 = 'l';
          pcVar2 = ctx->p;
          ctx->p = pcVar2 + 1;
          *pcVar2 = 'l';
        }
        else {
          local_d8 = (undefined1  [8])types;
          ud.member._4_1_ = fVar3;
          (*pf)(ctx,(flatcc_json_printer_union_descriptor_t *)local_d8);
        }
        unique0x10000342 = register0x00000000 - 1;
      }
      while (stack0xffffffffffffffa8 != 0) {
        types = types + 4;
        _count = (void *)((long)_count + 1);
        fVar3 = __flatbuffers_utype_read_from_pe(_count);
        pcVar2 = ctx->p;
        ctx->p = pcVar2 + 1;
        *pcVar2 = ',';
        if (fVar3 == '\0') {
          pcVar2 = ctx->p;
          ctx->p = pcVar2 + 1;
          *pcVar2 = 'n';
          pcVar2 = ctx->p;
          ctx->p = pcVar2 + 1;
          *pcVar2 = 'u';
          pcVar2 = ctx->p;
          ctx->p = pcVar2 + 1;
          *pcVar2 = 'l';
          pcVar2 = ctx->p;
          ctx->p = pcVar2 + 1;
          *pcVar2 = 'l';
          unique0x1000034a = stack0xffffffffffffffa8 - 1;
        }
        else {
          local_d8 = (undefined1  [8])types;
          ud.member._4_1_ = fVar3;
          (*pf)(ctx,(flatcc_json_printer_union_descriptor_t *)local_d8);
          unique0x10000346 = stack0xffffffffffffffa8 - 1;
        }
      }
      if (ctx->indent != '\0') {
        pcVar2 = ctx->p;
        ctx->p = pcVar2 + 1;
        *pcVar2 = '\n';
        ctx->level = ctx->level + -1;
        print_indent(ctx);
      }
      pcVar2 = ctx->p;
      ctx->p = pcVar2 + 1;
      *pcVar2 = ']';
    }
    return;
  }
  flatcc_json_printer_set_error(ctx,1);
  __assert_fail("0 && \"identifier too long\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_printer.c"
                ,0x41c,
                "void flatcc_json_printer_union_vector_field(flatcc_json_printer_t *, flatcc_json_printer_table_descriptor_t *, int, const char *, size_t, flatcc_json_printer_union_type_f *, flatcc_json_printer_union_f *)"
               );
}

Assistant:

void flatcc_json_printer_union_vector_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        flatcc_json_printer_union_type_f ptf,
        flatcc_json_printer_union_f pf)
{
    const uoffset_t *pt = get_field_ptr(td, id - 1);
    const uoffset_t *p = get_field_ptr(td, id);
    utype_t *types, type;
    uoffset_t count;
    char type_name[FLATCC_JSON_PRINT_NAME_LEN_MAX + 5];
    flatcc_json_printer_union_descriptor_t ud;

    ud.ttl = td->ttl;
    if (len > FLATCC_JSON_PRINT_NAME_LEN_MAX) {
        RAISE_ERROR(bad_input);
        FLATCC_ASSERT(0 && "identifier too long");
        return;
    }
    memcpy(type_name, name, len);
    memcpy(type_name + len, "_type", 5);
    if (p && pt) {
        flatcc_json_printer_utype_enum_vector_field(ctx, td, id - 1,
                type_name, len + 5, ptf);
        if (td->count++) {
            print_char(',');
        }
        p = read_uoffset_ptr(p);
        pt = read_uoffset_ptr(pt);
        count = __flatbuffers_uoffset_read_from_pe(p);
        ++p;
        ++pt;
        types = (utype_t *)pt;
        print_name(ctx, name, len);
        print_start('[');

        if (count) {
            type = __flatbuffers_utype_read_from_pe(types);
            if (type != 0) {
                ud.type = type;
                ud.member = p;
                pf(ctx, &ud);
            } else {
                print_null();
            }
            --count;
        }
        while (count--) {
            ++p;
            ++types;
            type = __flatbuffers_utype_read_from_pe(types);
            print_char(',');
            if (type != 0) {
                ud.type = type;
                ud.member = p;
                pf(ctx, &ud);
            } else {
                print_null();
            }
        }
        print_end(']');
    }
}